

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  urlpieces *part;
  curl_proxytype cVar1;
  uint uVar2;
  char *pcVar3;
  void *pvVar4;
  _Bool _Var5;
  char cVar6;
  unsigned_short uVar7;
  CURLUcode CVar8;
  int iVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  size_t sVar12;
  connectdata *pcVar13;
  ssl_backend_data *psVar14;
  char *pcVar15;
  CURLU *u;
  byte *__dest;
  long lVar16;
  ulong uVar17;
  size_t sVar18;
  ulong uVar19;
  connectbundle *bundle;
  connectdata *pcVar20;
  ulong uVar21;
  Curl_handler *pCVar22;
  size_t sVar23;
  char **ppcVar24;
  Curl_handler **ppCVar25;
  char *pcVar26;
  bool bVar27;
  curltime cVar28;
  _Bool waitpipe;
  _Bool force_reuse;
  connectdata *conn_temp;
  char proxyuser [256];
  char *local_2a0;
  _Bool local_292;
  _Bool local_291;
  char *local_290;
  Curl_easy *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  size_t local_268;
  size_t local_260;
  _Bool *local_258;
  _Bool *local_250;
  connectdata *local_248;
  char *local_240;
  char *local_238 [31];
  undefined1 local_139;
  char local_138 [255];
  undefined1 local_39;
  
  *asyncp = false;
  (*Curl_cfree)((data->req).protop);
  (data->req).protop = (void *)0x0;
  (*Curl_cfree)((data->req).newurl);
  memset(&data->req,0,0x5a0);
  (data->req).maxdownload = -1;
  local_248 = (connectdata *)0x0;
  local_291 = false;
  local_292 = false;
  local_268 = Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  CVar10 = CURLE_URL_MALFORMAT;
  if ((data->change).url == (char *)0x0) goto switchD_0011a7a3_caseD_1;
  local_260 = sVar12;
  local_258 = asyncp;
  local_250 = protocol_done;
  pcVar13 = (connectdata *)(*Curl_ccalloc)(1,0x778);
  if (pcVar13 == (connectdata *)0x0) {
switchD_0011a7a3_caseD_7:
    CVar10 = CURLE_OUT_OF_MEMORY;
    goto switchD_0011a7a3_caseD_1;
  }
  sVar12 = Curl_ssl->sizeof_ssl_backend_data;
  psVar14 = (ssl_backend_data *)(*Curl_ccalloc)(4,sVar12);
  if (psVar14 == (ssl_backend_data *)0x0) {
    (*Curl_cfree)(pcVar13);
    goto switchD_0011a7a3_caseD_7;
  }
  pcVar13->ssl_extra = psVar14;
  pcVar13->ssl[0].backend = psVar14;
  pcVar13->ssl[1].backend = (ssl_backend_data *)((psVar14->tap_state).master_key + (sVar12 - 0x1c));
  pcVar13->proxy_ssl[0].backend =
       (ssl_backend_data *)((psVar14->tap_state).master_key + sVar12 * 2 + -0x1c);
  pcVar13->proxy_ssl[1].backend =
       (ssl_backend_data *)((psVar14->tap_state).master_key + sVar12 * 3 + -0x1c);
  pcVar13->handler = &Curl_handler_dummy;
  pcVar13->connection_id = -1;
  pcVar13->port = -1;
  pcVar13->remote_port = -1;
  pcVar13->sock[0] = -1;
  pcVar13->sock[1] = -1;
  pcVar13->tempsock[0] = -1;
  pcVar13->tempsock[1] = -1;
  Curl_conncontrol(pcVar13,1);
  cVar28 = Curl_now();
  (pcVar13->created).tv_sec = cVar28.tv_sec;
  (pcVar13->created).tv_usec = cVar28.tv_usec;
  cVar28 = Curl_now();
  (pcVar13->keepalive).tv_sec = cVar28.tv_sec;
  (pcVar13->keepalive).tv_usec = cVar28.tv_usec;
  pcVar13->upkeep_interval_ms = (data->set).upkeep_interval_ms;
  pcVar13->data = data;
  cVar1 = (data->set).proxytype;
  (pcVar13->http_proxy).proxytype = cVar1;
  (pcVar13->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar15 = (data->set).str[0x15];
  if (pcVar15 == (char *)0x0) {
    (pcVar13->bits).proxy = false;
LAB_0011a4dd:
    (pcVar13->bits).httpproxy = false;
    bVar27 = false;
  }
  else {
    bVar27 = *pcVar15 == '\0';
    (pcVar13->bits).proxy = !bVar27;
    if (bVar27) goto LAB_0011a4dd;
    bVar27 = cVar1 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
    (pcVar13->bits).httpproxy = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  }
  (pcVar13->bits).socksproxy = bVar27;
  pcVar15 = (data->set).str[0x16];
  if ((pcVar15 != (char *)0x0) && (*pcVar15 != '\0')) {
    (pcVar13->bits).proxy = true;
    (pcVar13->bits).socksproxy = true;
  }
  (pcVar13->bits).proxy_user_passwd = (data->set).str[0x2f] != (char *)0x0;
  (pcVar13->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar13->bits).user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (pcVar13->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar13->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (pcVar13->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (pcVar13->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (pcVar13->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (pcVar13->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (pcVar13->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (pcVar13->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  pcVar13->ip_version = (data->set).ipver;
  _Var5 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var5) && (pcVar13->master_buffer == (char *)0x0)) {
    pcVar15 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar13->master_buffer = pcVar15;
    if (pcVar15 != (char *)0x0) goto LAB_0011a5f7;
LAB_0011a6c6:
    Curl_llist_destroy(&pcVar13->send_pipe,(void *)0x0);
    Curl_llist_destroy(&pcVar13->recv_pipe,(void *)0x0);
    (*Curl_cfree)(pcVar13->master_buffer);
    (*Curl_cfree)(pcVar13->localdev);
    (*Curl_cfree)(pcVar13->ssl_extra);
    (*Curl_cfree)(pcVar13);
    goto switchD_0011a7a3_caseD_7;
  }
LAB_0011a5f7:
  Curl_llist_init(&pcVar13->send_pipe,llist_dtor);
  Curl_llist_init(&pcVar13->recv_pipe,llist_dtor);
  pcVar15 = (data->set).str[8];
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (*Curl_cstrdup)(pcVar15);
    pcVar13->localdev = pcVar15;
    if (pcVar15 == (char *)0x0) goto LAB_0011a6c6;
  }
  pcVar13->localportrange = (data->set).localportrange;
  pcVar13->localport = (data->set).localport;
  pvVar4 = (data->set).closesocket_client;
  pcVar13->fclosesocket = (data->set).fclosesocket;
  pcVar13->closesocket_client = pvVar4;
  *in_connect = pcVar13;
  Curl_up_free(data);
  u = curl_url();
  (data->state).uh = u;
  if (u == (CURLU *)0x0) goto switchD_0011a7a3_caseD_7;
  pcVar15 = (data->change).url;
  if ((data->set).str[7] != (char *)0x0) {
    _Var5 = Curl_is_absolute_url(pcVar15,(char *)0x0,8);
    if (_Var5) {
      pcVar15 = (data->change).url;
    }
    else {
      if ((data->change).url_alloc == true) {
        (*Curl_cfree)((data->change).url);
      }
      pcVar15 = curl_maprintf("%s://%s",(data->set).str[7],(data->change).url);
      if (pcVar15 == (char *)0x0) goto switchD_0011a7a3_caseD_7;
      (data->change).url = pcVar15;
      (data->change).url_alloc = true;
    }
  }
  CVar8 = curl_url_set(u,CURLUPART_URL,pcVar15,
                       (uint)(data->set).disallow_username_in_url * 0x20 +
                       (uint)(data->set).path_as_is * 0x10 + 0x208);
  switch(CVar8) {
  case CURLUE_OK:
    part = &(data->state).up;
    CVar8 = curl_url_get(u,CURLUPART_SCHEME,&part->scheme,0);
    switch(CVar8) {
    case CURLUE_OK:
      local_288 = (Curl_easy *)part->scheme;
      pCVar22 = &Curl_handler_http;
      ppCVar25 = protocols;
      do {
        ppCVar25 = ppCVar25 + 1;
        iVar9 = Curl_strcasecompare(pCVar22->scheme,(char *)local_288);
        if (iVar9 != 0) {
          if ((((uint)(data->set).allowed_protocols & pCVar22->protocol) != 0) &&
             (((data->state).this_is_a_follow != true ||
              (((uint)(data->set).redir_protocols & pCVar22->protocol) != 0)))) {
            pcVar13->given = pCVar22;
            pcVar13->handler = pCVar22;
            ppcVar24 = &(data->state).up.user;
            CVar8 = curl_url_get(u,CURLUPART_USER,ppcVar24,0x40);
            CVar11 = CURLE_URL_MALFORMAT;
            switch(CVar8) {
            case CURLUE_OK:
              pcVar15 = (*Curl_cstrdup)(*ppcVar24);
              pcVar13->user = pcVar15;
              if (pcVar15 == (char *)0x0) goto switchD_0011a7a3_caseD_7;
              (pcVar13->bits).user_passwd = true;
              break;
            case CURLUE_BAD_HANDLE:
            case CURLUE_BAD_PARTPOINTER:
            case CURLUE_MALFORMED_INPUT:
            case CURLUE_BAD_PORT_NUMBER:
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
              goto switchD_0011a7a3_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0011a7a3_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0011a7a3_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0011a7a3_caseD_8;
            case CURLUE_NO_USER:
              break;
            default:
              goto switchD_0011a88e_default;
            }
            ppcVar24 = &(data->state).up.password;
            CVar11 = CURLE_URL_MALFORMAT;
            CVar10 = CURLE_URL_MALFORMAT;
            CVar8 = curl_url_get(u,CURLUPART_PASSWORD,ppcVar24,0x40);
            switch(CVar8) {
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0011a7a3_caseD_5;
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
            case CURLUE_NO_USER:
              goto switchD_0011a7a3_caseD_1;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0011a7a3_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0011a7a3_caseD_8;
            case CURLUE_NO_PASSWORD:
              break;
            default:
              if (CVar8 != CURLUE_OK) goto switchD_0011a88e_default;
              pcVar15 = (*Curl_cstrdup)(*ppcVar24);
              pcVar13->passwd = pcVar15;
              if (pcVar15 == (char *)0x0) goto switchD_0011a976_caseD_7;
              (pcVar13->bits).user_passwd = true;
            }
            ppcVar24 = &(data->state).up.options;
            CVar8 = curl_url_get(u,CURLUPART_OPTIONS,ppcVar24,0x40);
            switch(CVar8) {
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0011a976_caseD_5;
            case CURLUE_URLDECODE:
            case CURLUE_UNKNOWN_PART:
            case CURLUE_NO_SCHEME:
            case CURLUE_NO_USER:
            case CURLUE_NO_PASSWORD:
              goto switchD_0011a88e_default;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0011a976_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              CVar11 = CURLE_LOGIN_DENIED;
              goto switchD_0011a88e_default;
            case CURLUE_NO_OPTIONS:
              goto switchD_0011a976_caseD_d;
            }
            if (CVar8 != CURLUE_OK) goto switchD_0011a88e_default;
            pcVar15 = (*Curl_cstrdup)(*ppcVar24);
            pcVar13->options = pcVar15;
            if (pcVar15 == (char *)0x0) goto switchD_0011a976_caseD_7;
switchD_0011a976_caseD_d:
            CVar8 = curl_url_get(u,CURLUPART_HOST,&(data->state).up.hostname,0);
            if ((CVar8 != CURLUE_OK) &&
               (iVar9 = Curl_strcasecompare("file",part->scheme), iVar9 == 0))
            goto switchD_0011a976_caseD_7;
            CVar8 = curl_url_get(u,CURLUPART_PATH,&(data->state).up.path,0);
            switch(CVar8) {
            case CURLUE_OK:
              goto switchD_0011aa09_caseD_0;
            case CURLUE_BAD_HANDLE:
            case CURLUE_BAD_PARTPOINTER:
            case CURLUE_MALFORMED_INPUT:
            case CURLUE_BAD_PORT_NUMBER:
            case CURLUE_URLDECODE:
              goto switchD_0011a7a3_caseD_1;
            case CURLUE_UNSUPPORTED_SCHEME:
              goto switchD_0011a7a3_caseD_5;
            case CURLUE_OUT_OF_MEMORY:
              goto switchD_0011a7a3_caseD_7;
            case CURLUE_USER_NOT_ALLOWED:
              goto switchD_0011a7a3_caseD_8;
            default:
              goto switchD_0011a88e_default;
            }
          }
          break;
        }
        pCVar22 = *ppCVar25;
      } while (pCVar22 != (Curl_handler *)0x0);
      Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_288);
switchD_0011a976_caseD_5:
      CVar11 = CURLE_UNSUPPORTED_PROTOCOL;
      break;
    default:
      goto switchD_0011a7a3_caseD_1;
    case CURLUE_UNSUPPORTED_SCHEME:
      goto switchD_0011a7a3_caseD_5;
    case CURLUE_OUT_OF_MEMORY:
      goto switchD_0011a7a3_caseD_7;
    case CURLUE_USER_NOT_ALLOWED:
      goto switchD_0011a7a3_caseD_8;
    }
    break;
  default:
    goto switchD_0011a7a3_caseD_1;
  case CURLUE_UNSUPPORTED_SCHEME:
switchD_0011a7a3_caseD_5:
    CVar10 = CURLE_UNSUPPORTED_PROTOCOL;
    goto switchD_0011a7a3_caseD_1;
  case CURLUE_OUT_OF_MEMORY:
    goto switchD_0011a7a3_caseD_7;
  case CURLUE_USER_NOT_ALLOWED:
switchD_0011a7a3_caseD_8:
    CVar10 = CURLE_LOGIN_DENIED;
    goto switchD_0011a7a3_caseD_1;
  }
  goto switchD_0011a88e_default;
switchD_0011aa09_caseD_0:
  ppcVar24 = &(data->state).up.port;
  CVar8 = curl_url_get(u,CURLUPART_PORT,ppcVar24,1);
  if (CVar8 == CURLUE_OK) {
    uVar17 = strtoul(*ppcVar24,(char **)0x0,10);
    uVar7 = curlx_ultous(uVar17);
    pcVar13->remote_port = (uint)uVar7;
  }
  else {
    iVar9 = Curl_strcasecompare("file",part->scheme);
    if (iVar9 == 0) goto switchD_0011a976_caseD_7;
  }
  curl_url_get(u,CURLUPART_QUERY,&(data->state).up.query,0);
  pcVar15 = (data->state).up.hostname;
  pcVar26 = "";
  if (pcVar15 != (char *)0x0) {
    pcVar26 = pcVar15;
  }
  if (*pcVar26 == '[') {
    pcVar26 = pcVar26 + 1;
    __dest = (byte *)strchr(pcVar26,0x25);
    (pcVar13->bits).ipv6_ip = true;
    if (__dest != (byte *)0x0) {
      iVar9 = *__dest - 0x25;
      if ((iVar9 == 0) && (iVar9 = __dest[1] - 0x32, iVar9 == 0)) {
        iVar9 = 0x35 - (uint)__dest[2];
      }
      else {
        iVar9 = -iVar9;
      }
      if (iVar9 == 0) {
        lVar16 = 3;
      }
      else {
        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
        lVar16 = 1;
      }
      uVar17 = strtoul((char *)(__dest + lVar16),local_238,10);
      if (*local_238[0] == ']') {
        sVar18 = strlen(local_238[0]);
        memmove(__dest,local_238[0],sVar18 + 1);
        pcVar13->scope_id = (uint)uVar17;
      }
      else {
        Curl_infof(data,"Invalid IPv6 address format\n");
      }
    }
    pcVar15 = strchr(pcVar26,0x5d);
    if (pcVar15 != (char *)0x0) {
      *pcVar15 = '\0';
    }
  }
  pcVar15 = (*Curl_cstrdup)(pcVar26);
  (pcVar13->host).rawalloc = pcVar15;
  if (pcVar15 == (char *)0x0) goto switchD_0011a976_caseD_7;
  (pcVar13->host).name = pcVar15;
  uVar2 = (data->set).scope_id;
  if (uVar2 != 0) {
    pcVar13->scope_id = uVar2;
  }
  pcVar15 = (data->set).str[0x39];
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (*Curl_cstrdup)(pcVar15);
    pcVar13->oauth_bearer = pcVar15;
    if (pcVar15 == (char *)0x0) goto switchD_0011a976_caseD_7;
  }
  pcVar15 = (data->set).str[0x3a];
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (*Curl_cstrdup)(pcVar15);
    pcVar13->unix_domain_socket = pcVar15;
    if (pcVar15 == (char *)0x0) goto switchD_0011a976_caseD_7;
    pcVar13->abstract_unix_socket = (data->set).abstract_unix_socket;
  }
  local_288 = pcVar13->data;
  if ((pcVar13->bits).proxy_user_passwd == true) {
    memset(local_238,0,0x100);
    memset(local_138,0,0x100);
    pcVar15 = (local_288->set).str[0x2f];
    if (pcVar15 != (char *)0x0) {
      strncpy((char *)local_238,pcVar15,0x100);
      local_139 = 0;
    }
    pcVar15 = (local_288->set).str[0x30];
    if (pcVar15 != (char *)0x0) {
      strncpy(local_138,pcVar15,0x100);
      local_39 = 0;
    }
    CVar10 = Curl_urldecode(local_288,(char *)local_238,0,&(pcVar13->http_proxy).user,(size_t *)0x0,
                            false);
    if (CVar10 != CURLE_OK) goto LAB_0011ad06;
    local_290 = (char *)0x0;
    CVar10 = Curl_urldecode(local_288,local_138,0,&(pcVar13->http_proxy).passwd,(size_t *)0x0,false)
    ;
    local_2a0 = (char *)0x0;
    if (CVar10 != CURLE_OK) goto LAB_0011b2cd;
  }
  pcVar15 = (local_288->set).str[0x15];
  if (pcVar15 == (char *)0x0) {
    local_2a0 = (char *)0x0;
  }
  else {
    local_2a0 = (*Curl_cstrdup)(pcVar15);
    if (local_2a0 == (char *)0x0) {
      local_290 = (char *)0x0;
      Curl_failf(local_288,"memory shortage");
      CVar10 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011b2c4;
    }
  }
  pcVar15 = (local_288->set).str[0x16];
  if (pcVar15 == (char *)0x0) {
    local_290 = (char *)0x0;
  }
  else {
    local_290 = (*Curl_cstrdup)(pcVar15);
    if (local_290 == (char *)0x0) {
      local_290 = (char *)0x0;
      Curl_failf(local_288,"memory shortage");
      CVar10 = CURLE_OUT_OF_MEMORY;
      goto LAB_0011b2cd;
    }
  }
  if ((local_288->set).str[0x31] == (char *)0x0) {
    pcVar15 = "no_proxy";
    local_278 = curl_getenv("no_proxy");
    if (local_278 == (char *)0x0) {
      pcVar15 = "NO_PROXY";
      local_278 = curl_getenv("NO_PROXY");
      if (local_278 == (char *)0x0) goto LAB_0011adf9;
    }
    Curl_infof(pcVar13->data,"Uses proxy env variable %s == \'%s\'\n",pcVar15,local_278);
  }
  else {
LAB_0011adf9:
    local_278 = (char *)0x0;
  }
  pcVar15 = (local_288->set).str[0x31];
  if (pcVar15 == (char *)0x0) {
    pcVar15 = local_278;
  }
  if ((pcVar15 == (char *)0x0) || (*pcVar15 == '\0')) goto LAB_0011afea;
  local_280 = (pcVar13->host).name;
  iVar9 = Curl_strcasecompare("*",pcVar15);
  if (iVar9 != 0) goto LAB_0011ae97;
  sVar18 = strlen(pcVar15);
  if (*local_280 == '[') {
    local_270 = strchr(local_280,0x5d);
    if (local_270 == (char *)0x0) goto LAB_0011afea;
    local_280 = local_280 + 1;
    local_270 = local_270 + -(long)local_280;
  }
  else {
    local_270 = (char *)strlen(local_280);
  }
  if (sVar18 == 0) goto LAB_0011afea;
  local_280 = local_280 + (long)local_270;
  uVar17 = 0;
  goto LAB_0011af22;
LAB_0011ae97:
  (*Curl_cfree)(local_2a0);
  (*Curl_cfree)(local_290);
  (*Curl_cfree)(local_278);
LAB_0011b298:
  (pcVar13->bits).proxy = false;
  (pcVar13->bits).httpproxy = false;
  (pcVar13->bits).socksproxy = false;
  (pcVar13->bits).proxy_user_passwd = false;
  (pcVar13->bits).tunnel_proxy = false;
LAB_0011b2c2:
  local_290 = (char *)0x0;
  CVar10 = CURLE_OK;
  goto LAB_0011b2c4;
LAB_0011af22:
  do {
    uVar21 = uVar17 + 1;
    if (uVar17 + 1 < sVar18) {
      uVar21 = sVar18;
    }
    do {
      uVar19 = uVar17;
      if ((0x2c < (ulong)(byte)pcVar15[uVar17]) ||
         ((0x100100000001U >> ((ulong)(byte)pcVar15[uVar17] & 0x3f) & 1) == 0)) break;
      uVar17 = uVar17 + 1;
      uVar19 = uVar21;
    } while (uVar21 != uVar17);
    if (uVar19 == sVar18) break;
    uVar17 = uVar19;
    sVar23 = uVar19;
    if (uVar19 < sVar18) {
      do {
        if (((ulong)(byte)pcVar15[sVar23] < 0x2d) &&
           (uVar17 = sVar23, (0x100100000001U >> ((ulong)(byte)pcVar15[sVar23] & 0x3f) & 1) != 0))
        break;
        sVar23 = sVar23 + 1;
        uVar17 = sVar18;
      } while (sVar18 != sVar23);
    }
    lVar16 = (pcVar15[uVar19] == '.') + uVar19;
    pcVar26 = (char *)(uVar17 - lVar16);
    if (pcVar26 <= local_270) {
      local_240 = local_280 + -(long)pcVar26;
      iVar9 = Curl_strncasecompare(pcVar15 + lVar16,local_240,(size_t)pcVar26);
      if ((iVar9 != 0) && ((pcVar26 == local_270 || (local_240[-1] == '.')))) goto LAB_0011ae97;
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 < sVar18);
LAB_0011afea:
  if (local_2a0 == (char *)0x0 && local_290 == (char *)0x0) {
    pcVar26 = pcVar13->handler->scheme;
    cVar6 = *pcVar26;
    pcVar15 = (char *)local_238;
    ppcVar24 = (char **)pcVar15;
    if (cVar6 != '\0') {
      ppcVar24 = local_238;
      do {
        pcVar26 = pcVar26 + 1;
        iVar9 = tolower((int)cVar6);
        *(char *)ppcVar24 = (char)iVar9;
        ppcVar24 = (char **)((long)ppcVar24 + 1);
        cVar6 = *pcVar26;
      } while (cVar6 != '\0');
    }
    builtin_strncpy((char *)((long)ppcVar24 + 3),"oxy",4);
    *(undefined4 *)ppcVar24 = 0x6f72705f;
    local_2a0 = curl_getenv(pcVar15);
    if (local_2a0 == (char *)0x0) {
      pcVar15 = (char *)local_238;
      iVar9 = Curl_strcasecompare("http_proxy",pcVar15);
      if (iVar9 == 0) {
        Curl_strntoupper(pcVar15,pcVar15,0x80);
        local_2a0 = curl_getenv(pcVar15);
        if (local_2a0 != (char *)0x0) goto LAB_0011b0d1;
      }
      pcVar15 = "all_proxy";
      local_2a0 = curl_getenv("all_proxy");
      if (local_2a0 != (char *)0x0) goto LAB_0011b0d1;
      pcVar15 = "ALL_PROXY";
      local_2a0 = curl_getenv("ALL_PROXY");
      if (local_2a0 != (char *)0x0) goto LAB_0011b0d1;
      local_2a0 = (char *)0x0;
    }
    else {
LAB_0011b0d1:
      Curl_infof(pcVar13->data,"Uses proxy env variable %s == \'%s\'\n",pcVar15,local_2a0);
    }
    local_290 = (char *)0x0;
  }
  (*Curl_cfree)(local_278);
  if (local_2a0 == (char *)0x0) {
LAB_0011b126:
    local_2a0 = (char *)0x0;
  }
  else if (((pcVar13->unix_domain_socket != (char *)0x0) || (*local_2a0 == '\0')) ||
          ((pcVar13->handler->flags & 0x10) != 0)) {
    (*Curl_cfree)(local_2a0);
    goto LAB_0011b126;
  }
  if (local_290 == (char *)0x0) {
LAB_0011b16b:
    if (local_2a0 == (char *)0x0) goto LAB_0011b298;
    local_290 = (char *)0x0;
    bVar27 = false;
LAB_0011b182:
    CVar10 = parse_proxy(local_288,pcVar13,local_2a0,(pcVar13->http_proxy).proxytype);
    (*Curl_cfree)(local_2a0);
    if (CVar10 == CURLE_OK) {
      if (bVar27) goto LAB_0011b1b8;
      goto LAB_0011b1ea;
    }
  }
  else {
    if ((*local_290 == '\0') || ((pcVar13->handler->flags & 0x10) != 0)) {
      (*Curl_cfree)(local_290);
      goto LAB_0011b16b;
    }
    bVar27 = true;
    if (local_2a0 != (char *)0x0) goto LAB_0011b182;
LAB_0011b1b8:
    pcVar15 = local_290;
    CVar10 = parse_proxy(local_288,pcVar13,local_290,(pcVar13->socks_proxy).proxytype);
    (*Curl_cfree)(pcVar15);
    if (CVar10 == CURLE_OK) {
LAB_0011b1ea:
      if ((pcVar13->http_proxy).host.rawalloc == (char *)0x0) {
        (pcVar13->bits).httpproxy = false;
        (pcVar13->bits).tunnel_proxy = false;
        if ((pcVar13->socks_proxy).host.rawalloc == (char *)0x0) {
          (pcVar13->bits).proxy = false;
          goto LAB_0011b298;
        }
        if ((pcVar13->socks_proxy).user == (char *)0x0) {
          pcVar15 = (pcVar13->socks_proxy).passwd;
          (pcVar13->socks_proxy).user = (pcVar13->http_proxy).user;
          CVar10 = CURLE_OK;
          (pcVar13->http_proxy).user = (char *)0x0;
          (*Curl_cfree)(pcVar15);
          (pcVar13->socks_proxy).passwd = (pcVar13->http_proxy).passwd;
          (pcVar13->http_proxy).passwd = (char *)0x0;
          (pcVar13->bits).socksproxy = true;
          if (((pcVar13->bits).httpproxy & 1U) == 0) {
            (pcVar13->bits).proxy = true;
            goto LAB_0011ad06;
          }
          goto LAB_0011b891;
        }
        (pcVar13->bits).socksproxy = true;
        (pcVar13->bits).proxy = true;
      }
      else {
        if ((pcVar13->handler->protocol & 3) == 0) {
          if (((pcVar13->handler->flags & 0x800) == 0) || ((pcVar13->bits).tunnel_proxy != false)) {
            (pcVar13->bits).tunnel_proxy = true;
          }
          else {
            pcVar13->handler = &Curl_handler_http;
          }
        }
        (pcVar13->bits).httpproxy = true;
        (pcVar13->bits).socksproxy = (pcVar13->socks_proxy).host.rawalloc != (char *)0x0;
LAB_0011b891:
        (pcVar13->bits).proxy = true;
      }
      goto LAB_0011b2c2;
    }
LAB_0011ad06:
    local_290 = (char *)0x0;
  }
LAB_0011b2c4:
  local_2a0 = (char *)0x0;
LAB_0011b2cd:
  (*Curl_cfree)(local_290);
  (*Curl_cfree)(local_2a0);
  if (CVar10 != CURLE_OK) goto switchD_0011a7a3_caseD_1;
  if (((pcVar13->given->flags & 1) != 0) && ((pcVar13->bits).httpproxy == true)) {
    (pcVar13->bits).tunnel_proxy = true;
  }
  lVar16 = (data->set).use_port;
  if ((lVar16 == 0) || ((data->state).allow_port != true)) {
LAB_0011b373:
    CVar11 = override_login(data,pcVar13,&pcVar13->user,&pcVar13->passwd,&pcVar13->options);
    if ((((((CVar11 == CURLE_OK) && (CVar11 = set_login(pcVar13), CVar11 == CURLE_OK)) &&
          (CVar11 = parse_connect_to_slist(data,pcVar13,(data->set).connect_to), CVar11 == CURLE_OK)
          ) && (CVar11 = fix_hostname((connectdata *)pcVar13->data,&pcVar13->host),
               CVar11 == CURLE_OK)) &&
        ((((pcVar13->bits).conn_to_host != true ||
          (CVar11 = fix_hostname((connectdata *)pcVar13->data,&pcVar13->conn_to_host),
          CVar11 == CURLE_OK)) &&
         (((pcVar13->bits).httpproxy != true ||
          (CVar11 = fix_hostname((connectdata *)pcVar13->data,&(pcVar13->http_proxy).host),
          CVar11 == CURLE_OK)))))) &&
       (((pcVar13->bits).socksproxy != true ||
        (CVar11 = fix_hostname((connectdata *)pcVar13->data,&(pcVar13->socks_proxy).host),
        CVar11 == CURLE_OK)))) {
      if (((pcVar13->bits).conn_to_host == true) &&
         (iVar9 = Curl_strcasecompare((pcVar13->conn_to_host).name,(pcVar13->host).name), iVar9 != 0
         )) {
        (pcVar13->bits).conn_to_host = false;
      }
      cVar6 = (pcVar13->bits).conn_to_port;
      if (((_Bool)cVar6 == true) && (pcVar13->conn_to_port == pcVar13->remote_port)) {
        (pcVar13->bits).conn_to_port = false;
        cVar6 = '\0';
      }
      if ((((pcVar13->bits).conn_to_host != false) || (cVar6 != '\0')) &&
         ((pcVar13->bits).httpproxy == true)) {
        (pcVar13->bits).tunnel_proxy = true;
      }
      pcVar13->socktype = 1;
      pCVar22 = pcVar13->handler;
      if (pCVar22->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
        CVar11 = (*pCVar22->setup_connection)(pcVar13);
        if (CVar11 != CURLE_OK) goto switchD_0011a88e_default;
        pCVar22 = pcVar13->handler;
      }
      if (pcVar13->port < 0) {
        pcVar13->port = pCVar22->defport;
      }
      pcVar13->recv[0] = Curl_recv_plain;
      pcVar13->send[0] = Curl_send_plain;
      pcVar13->recv[1] = Curl_recv_plain;
      pcVar13->send[1] = Curl_send_plain;
      (pcVar13->bits).tcp_fastopen = (data->set).tcp_fastopen;
      if ((pCVar22->flags & 0x10) == 0) {
        pcVar15 = (data->set).str[0x1b];
        (data->set).ssl.primary.CApath = (data->set).str[0x1a];
        (data->set).proxy_ssl.primary.CApath = pcVar15;
        (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
        (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
        pcVar15 = (data->set).str[0x25];
        (data->set).ssl.primary.random_file = pcVar15;
        (data->set).proxy_ssl.primary.random_file = pcVar15;
        pcVar15 = (data->set).str[0x24];
        (data->set).ssl.primary.egdsocket = pcVar15;
        (data->set).proxy_ssl.primary.egdsocket = pcVar15;
        (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
        (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
        (data->set).ssl.primary.cipher_list13 = (data->set).str[0x22];
        (data->set).proxy_ssl.primary.cipher_list13 = (data->set).str[0x23];
        (data->set).ssl.CRLfile = (data->set).str[0x27];
        (data->set).proxy_ssl.CRLfile = (data->set).str[0x28];
        (data->set).ssl.issuercert = (data->set).str[0x29];
        (data->set).proxy_ssl.issuercert = (data->set).str[0x2a];
        pcVar15 = (data->set).str[0];
        pcVar26 = (data->set).str[1];
        (data->set).ssl.cert = pcVar15;
        (data->set).proxy_ssl.cert = pcVar26;
        (data->set).ssl.cert_type = (data->set).str[2];
        (data->set).proxy_ssl.cert_type = (data->set).str[3];
        pcVar3 = (data->set).str[0xe];
        (data->set).ssl.key = (data->set).str[0xd];
        (data->set).proxy_ssl.key = pcVar3;
        (data->set).ssl.key_type = (data->set).str[0x11];
        (data->set).proxy_ssl.key_type = (data->set).str[0x12];
        (data->set).ssl.key_passwd = (data->set).str[0xf];
        (data->set).proxy_ssl.key_passwd = (data->set).str[0x10];
        (data->set).ssl.primary.clientcert = pcVar15;
        (data->set).proxy_ssl.primary.clientcert = pcVar26;
        _Var5 = Curl_clone_primary_ssl_config(&(data->set).ssl.primary,&pcVar13->ssl_config);
        if (!_Var5) goto switchD_0011a976_caseD_7;
        _Var5 = Curl_clone_primary_ssl_config
                          (&(data->set).proxy_ssl.primary,&pcVar13->proxy_ssl_config);
        CVar10 = CURLE_OUT_OF_MEMORY;
        if (!_Var5) goto switchD_0011a7a3_caseD_1;
        prune_dead_connections(data);
        if ((((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)) ||
           (_Var5 = ConnectionExists(data,pcVar13,&local_248,&local_291,&local_292),
           pcVar20 = local_248, !_Var5)) {
LAB_0011b7a1:
          if ((pcVar13->handler->flags & 0x100) != 0) {
            if ((data->set).ssl_enable_alpn == true) {
              (pcVar13->bits).tls_enable_alpn = true;
            }
            if ((data->set).ssl_enable_npn == true) {
              (pcVar13->bits).tls_enable_npn = true;
            }
          }
          if (local_292 != false) {
LAB_0011b7e0:
            Curl_infof(data,"No connections available.\n");
            conn_free(pcVar13);
            *in_connect = (connectdata *)0x0;
            CVar10 = CURLE_NO_CONNECTION_AVAILABLE;
            goto switchD_0011a7a3_caseD_1;
          }
          bundle = Curl_conncache_find_bundle(pcVar13,(data->state).conn_cache);
          if ((bundle == (connectbundle *)0x0 || local_268 == 0) ||
             (bundle->num_connections < local_268)) {
            Curl_conncache_unlock(pcVar13);
          }
          else {
            pcVar20 = Curl_conncache_extract_bundle(data,bundle);
            Curl_conncache_unlock(pcVar13);
            if (pcVar20 == (connectdata *)0x0) {
              Curl_infof(data,"No more connections allowed to host: %zu\n",local_268);
              goto LAB_0011b7e0;
            }
            Curl_disconnect(data,pcVar20,false);
          }
          if ((local_260 != 0) && (sVar12 = Curl_conncache_size(data), local_260 <= sVar12)) {
            pcVar20 = Curl_conncache_extract_oldest(data);
            if (pcVar20 == (connectdata *)0x0) {
              Curl_infof(data,"No connections available in cache\n");
              goto LAB_0011b7e0;
            }
            Curl_disconnect(data,pcVar20,false);
          }
          CVar11 = Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
          if (CVar11 != CURLE_OK) goto switchD_0011a88e_default;
          if ((((data->state).authhost.picked & 0x28) != 0) && ((data->state).authhost.done == true)
             ) {
            Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
            (data->state).authhost.picked = 0;
            (data->state).authhost.done = false;
          }
          if ((((data->state).authproxy.picked & 0x28) != 0) &&
             ((data->state).authproxy.done == true)) {
            Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
            (data->state).authproxy.picked = 0;
            (data->state).authproxy.done = false;
          }
        }
        else {
          if (((local_291 == false) && (iVar9 = IsPipeliningPossible(data,local_248), iVar9 != 0))
             && ((pcVar20->recv_pipe).size + (pcVar20->send_pipe).size != 0)) {
            Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                       pcVar20->connection_id);
            sVar12 = Curl_conncache_bundle_size(pcVar20);
            if ((sVar12 < local_268) && (sVar12 = Curl_conncache_size(data), sVar12 < local_260)) {
              Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
              Curl_conncache_return_conn(pcVar20);
              goto LAB_0011b7a1;
            }
          }
          reuse_conn(pcVar13,pcVar20);
          (*Curl_cfree)(pcVar13->ssl_extra);
          (*Curl_cfree)(pcVar13);
          *in_connect = pcVar20;
          pcVar15 = "host";
          if ((pcVar20->bits).proxy != false) {
            pcVar15 = "proxy";
          }
          lVar16 = 0x120;
          if (((pcVar20->socks_proxy).host.name == (char *)0x0) &&
             (lVar16 = 0x160, (pcVar20->http_proxy).host.name == (char *)0x0)) {
            lVar16 = 0xd8;
          }
          Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",pcVar20->connection_id
                     ,pcVar15,*(undefined8 *)((pcVar20->chunk).hexbuffer + lVar16 + -0x20));
          pcVar13 = pcVar20;
        }
        Curl_init_do(data,pcVar13);
        CVar11 = setup_range(data);
        if (CVar11 == CURLE_OK) {
          pcVar13->seek_func = (data->set).seek_func;
          pcVar13->seek_client = (data->set).seek_client;
          CVar10 = resolve_server(data,pcVar13,local_258);
          goto LAB_0011baf2;
        }
      }
      else {
        Curl_persistconninfo(pcVar13);
        CVar11 = (*pcVar13->handler->connect_it)(pcVar13,(_Bool *)local_238);
        if (CVar11 == CURLE_OK) {
          pcVar13->data = data;
          (pcVar13->bits).tcpconnect[0] = true;
          CVar10 = Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
          if (CVar10 == CURLE_OK) {
            CVar10 = setup_range(data);
            if (CVar10 == CURLE_OK) {
              Curl_setup_transfer(pcVar13,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              goto LAB_0011b8ca;
            }
            (*pcVar13->handler->done)(pcVar13,CVar10,false);
          }
        }
        else {
LAB_0011b8ca:
          Curl_init_do(data,pcVar13);
          CVar10 = CVar11;
        }
LAB_0011baf2:
        if (CVar10 != CURLE_OK) goto switchD_0011a7a3_caseD_1;
        pcVar13 = *in_connect;
        if ((pcVar13->send_pipe).size + (pcVar13->recv_pipe).size != 0) {
          *local_250 = true;
          return CURLE_OK;
        }
        if (*local_258 != false) {
          return CURLE_OK;
        }
        CVar11 = Curl_setup_conn(pcVar13,local_250);
      }
    }
  }
  else {
    pcVar13->remote_port = (uint)lVar16 & 0xffff;
    curl_msnprintf((char *)local_238,0x10,"%u");
    CVar8 = curl_url_set((data->state).uh,CURLUPART_PORT,(char *)local_238,0);
    if (CVar8 == CURLUE_OK) goto LAB_0011b373;
switchD_0011a976_caseD_7:
    CVar11 = CURLE_OUT_OF_MEMORY;
  }
switchD_0011a88e_default:
  CVar10 = CVar11;
switchD_0011a7a3_caseD_1:
  if (CVar10 != CURLE_OK) {
    if (CVar10 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar10 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(data,*in_connect,true);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar10;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    if(CONN_INUSE(*in_connect))
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }
  else if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, *in_connect, TRUE);
    *in_connect = NULL; /* return a NULL */
  }

  return result;
}